

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O0

Image __thiscall
Renderer::render(Renderer *this,offset_in_Renderer_to_subr func,bool reportProgress)

{
  byte in_CL;
  TaskScheduler *in_RDI;
  int y;
  TaskScheduler tasks;
  type gfunc;
  Image film;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  anon_class_32_4_fc7da0eb *in_stack_fffffffffffffed8;
  function<void_()> *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  TaskScheduler *in_stack_fffffffffffffef0;
  int local_d4;
  TaskScheduler *in_stack_ffffffffffffff90;
  Image local_10;
  
  Image::Image((Image *)in_RDI,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
  std::
  bind<vec3f(Renderer::*&)(Ray,Sampler&),Renderer*,std::_Placeholder<1>const&,std::_Placeholder<2>const&>
            ((offset_in_Renderer_to_subr *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (Renderer **)in_stack_fffffffffffffee0,(_Placeholder<1> *)in_stack_fffffffffffffed8,
             (_Placeholder<2> *)in_RDI);
  TaskScheduler::TaskScheduler(in_RDI);
  for (local_d4 = 0; local_d4 < *(int *)((in_RDI->onprogress).super__Function_base._M_manager + 0xc)
      ; local_d4 = local_d4 + 1) {
    in_stack_fffffffffffffee8 = local_d4;
    in_stack_fffffffffffffef0 = in_RDI;
    std::function<void()>::
    function<Renderer::render(vec3f(Renderer::*)(Ray,Sampler&),bool)::__0,void>
              (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    TaskScheduler::add(in_RDI,(task_t *)
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    std::function<void_()>::~function((function<void_()> *)0x13ecaa);
  }
  if ((in_CL & 1) != 0) {
    std::function<void(int,int)>::operator=
              ((function<void_(int,_int)> *)in_stack_fffffffffffffef0,
               (anon_class_1_0_00000001 *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  TaskScheduler::start(in_stack_ffffffffffffff90);
  if ((in_CL & 1) != 0) {
    fprintf(_stderr,"\n");
  }
  TaskScheduler::~TaskScheduler(in_RDI);
  return local_10;
}

Assistant:

Image Renderer::render(decltype(&Renderer::radiance) func, bool reportProgress) {
	Image film(camera->resx, camera->resy);
	auto gfunc = std::bind(func, this, std::placeholders::_1, std::placeholders::_2);
	TaskScheduler tasks;
	for (int y=0; y<camera->resy; ++y) {
		tasks.add([&,y](){
			for (int x=0; x<camera->resx; ++x) {
				vec2f pixelsize = vec2f(1.0/camera->resx, 1.0/camera->resy);
				vec2f pixelpos = vec2f(x,y) * pixelsize;
				film.setPixel(x, y, renderPixel(gfunc, pixelpos, pixelsize));
			}
		});
	}
	if (reportProgress) {
		tasks.onprogress = [](int k, int n){
			fprintf(stderr, "\r    %.1f%% ", 100.0f*k/n);
		};
	}
	tasks.start();
	if (reportProgress) {
		fprintf(stderr, "\n"); // new line after progress
	}
	return film;
}